

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmptyFileCreatorByTypeTests.cpp
# Opt level: O2

void anon_unknown.dwarf_271d54::assertNewFileContents
               (string *extensionWithDot,string *expectedContents)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  ExpressionDecomposer local_174;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  anon_union_24_2_13149d16_for_String_3 local_150;
  undefined8 uStack_138;
  Enum local_130;
  string received;
  string local_108;
  Result local_e8;
  string local_c8 [32];
  ResultBuilder DOCTEST_RB;
  
  ApprovalTests::TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>
  ::getDefaultNamer();
  std::__cxx11::string::string(local_c8,(string *)extensionWithDot);
  (**(code **)(((DOCTEST_RB.super_AssertData.m_test_case)->m_file).field_0.data.ptr + 0x18))
            (&received,DOCTEST_RB.super_AssertData.m_test_case,local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DOCTEST_RB.super_AssertData.m_at);
  remove(received._M_dataplus._M_p);
  ApprovalTests::FileUtils::ensureFileExists(&received);
  doctest::String::String((String *)&local_150.data,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_CHECK,
             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/DocTest_Tests/utilities/EmptyFileCreatorByTypeTests.cpp"
             ,0x12,"expectedContents + \"\\n\" == FileUtils::readFileThrowIfMissing(received)","",
             (String *)&local_150.data);
  doctest::String::~String((String *)&local_150.data);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_174,DT_CHECK);
  std::operator+(&local_170,expectedContents,"\n");
  local_150._8_8_ = local_170._M_string_length;
  local_150.data.ptr = local_150.buf + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == &local_170.field_2) {
    uStack_138 = local_170.field_2._8_8_;
  }
  else {
    local_150.data.ptr = local_170._M_dataplus._M_p;
  }
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_130 = local_174.m_at;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ApprovalTests::FileUtils::readFileThrowIfMissing(&local_108,&received);
  doctest::detail::Expression_lhs<std::__cxx11::string>::operator==
            (&local_e8,(Expression_lhs<std::__cxx11::string> *)&local_150.data,&local_108);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_150.data);
  dVar2 = (double)std::__cxx11::string::~string((string *)&local_170);
  dVar2 = doctest::detail::ResultBuilder::log(&DOCTEST_RB,dVar2);
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  std::__cxx11::string::~string((string *)&received);
  return;
}

Assistant:

void assertNewFileContents(const std::string& extensionWithDot,
                               const std::string& expectedContents)
    {
        auto received = Approvals::getDefaultNamer()->getReceivedFile(extensionWithDot);
        remove(received.c_str());

        FileUtils::ensureFileExists(received);
        CHECK(expectedContents + "\n" == FileUtils::readFileThrowIfMissing(received));
    }